

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  float fVar1;
  bool bVar2;
  ImVec2 IVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  long *in_RCX;
  char *in_RDX;
  char *in_RSI;
  ImFont *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float char_width;
  uint c;
  char *prev_s;
  char c_1;
  char *s;
  char *word_wrap_eol;
  bool word_wrap_enabled;
  float line_width;
  float scale;
  float line_height;
  ImVec2 text_size;
  float local_84;
  float in_stack_ffffffffffffff90;
  char *pcVar9;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  char *local_58;
  char *local_50;
  float local_44;
  char *text_end_00;
  undefined4 in_stack_ffffffffffffffe0;
  float scale_00;
  ImFont *this_00;
  ImVec2 local_8;
  
  local_58 = in_RSI;
  this_00 = in_RDI;
  if (in_RDX == (char *)0x0) {
    sVar8 = strlen(in_RSI);
    in_RDX = in_RSI + sVar8;
  }
  fVar1 = in_RDI->FontSize;
  scale_00 = in_XMM0_Da;
  ImVec2::ImVec2(&local_8,0.0,0.0);
  local_44 = 0.0;
  bVar2 = in_XMM2_Da <= 0.0;
  local_50 = (char *)0x0;
  text_end_00 = local_58;
LAB_00156069:
  do {
    pcVar4 = local_58;
    if (in_RDX <= local_58) {
LAB_001562ce:
      local_58 = pcVar4;
      if (local_8.x < local_44) {
        local_8.x = local_44;
      }
      if ((0.0 < local_44) || ((local_8.y == 0.0 && (!NAN(local_8.y))))) {
        local_8.y = in_XMM0_Da + local_8.y;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = (long)local_58;
      }
      IVar3.y = local_8.y;
      IVar3.x = local_8.x;
      return IVar3;
    }
    if (bVar2) {
LAB_0015618c:
      uVar6 = (uint)*local_58;
      pcVar9 = local_58;
      if (uVar6 < 0x80) {
        local_58 = local_58 + 1;
      }
      else {
        iVar7 = ImTextCharFromUtf8((uint *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    in_stack_ffffffffffffffa0),local_58,
                                   (char *)CONCAT44(uVar6,in_stack_ffffffffffffff90));
        local_58 = local_58 + iVar7;
        pcVar4 = local_58;
        if (uVar6 == 0) goto LAB_001562ce;
      }
      if (uVar6 < 0x20) {
        if (uVar6 == 10) {
          local_8.x = ImMax<float>(local_8.x,local_44);
          local_8.y = in_XMM0_Da + local_8.y;
          local_44 = 0.0;
          goto LAB_00156069;
        }
        if (uVar6 == 0xd) goto LAB_00156069;
      }
      if ((int)uVar6 < (in_RDI->IndexAdvanceX).Size) {
        local_84 = (in_RDI->IndexAdvanceX).Data[uVar6];
      }
      else {
        local_84 = in_RDI->FallbackAdvanceX;
      }
      in_stack_ffffffffffffff90 = local_84 * (in_XMM0_Da / fVar1);
      pcVar4 = pcVar9;
      if (in_XMM1_Da <= local_44 + in_stack_ffffffffffffff90) goto LAB_001562ce;
      local_44 = in_stack_ffffffffffffff90 + local_44;
      goto LAB_00156069;
    }
    if ((local_50 == (char *)0x0) &&
       (local_50 = CalcWordWrapPositionA
                             (this_00,scale_00,
                              (char *)CONCAT44(in_XMM2_Da,in_stack_ffffffffffffffe0),text_end_00,
                              (float)((ulong)in_RDX >> 0x20)), local_50 == local_58)) {
      local_50 = local_50 + 1;
    }
    if (local_58 < local_50) goto LAB_0015618c;
    if (local_8.x < local_44) {
      local_8.x = local_44;
    }
    local_8.y = in_XMM0_Da + local_8.y;
    local_44 = 0.0;
    local_50 = (char *)0x0;
    for (; local_58 < in_RDX; local_58 = local_58 + 1) {
      in_stack_ffffffffffffffa7 = *local_58;
      bVar5 = ImCharIsBlankA(in_stack_ffffffffffffffa7);
      if (!bVar5) {
        if (in_stack_ffffffffffffffa7 == '\n') {
          local_58 = local_58 + 1;
        }
        break;
      }
    }
  } while( true );
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}